

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpen(sqlite3_vfs *pVfs,Pager **ppPager,char *zFilename,int nExtra,int flags,
                    int vfsFlags,_func_void_DbPage_ptr *xReinit)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Pager *pPVar4;
  sqlite3_file *psVar5;
  code *xStress;
  uint local_94;
  int iDc;
  int fout;
  char *z;
  char *pcStack_80;
  int nUri;
  char *zUri;
  u32 szPageDflt;
  int pcacheSize;
  int useJournal;
  int nPathname;
  char *zPathname;
  uint local_58;
  int journalFileSize;
  int readOnly;
  int memDb;
  int tempFile;
  int rc;
  Pager *pPager;
  u8 *pPtr;
  uint local_30;
  int vfsFlags_local;
  int flags_local;
  int nExtra_local;
  char *zFilename_local;
  Pager **ppPager_local;
  sqlite3_vfs *pVfs_local;
  
  _tempFile = (Pager *)0x0;
  memDb = 0;
  readOnly = 0;
  journalFileSize = 0;
  local_58 = 0;
  _useJournal = (char *)0x0;
  pcacheSize = 0;
  szPageDflt = (u32)((flags & 1U) == 0);
  pPtr._4_4_ = vfsFlags;
  local_30 = flags;
  vfsFlags_local = nExtra;
  _flags_local = zFilename;
  zFilename_local = (char *)ppPager;
  ppPager_local = (Pager **)pVfs;
  zUri._4_4_ = sqlite3PcacheSize();
  zUri._0_4_ = 0x1000;
  pcStack_80 = (char *)0x0;
  z._4_4_ = 0;
  iVar2 = sqlite3JournalSize((sqlite3_vfs *)ppPager_local);
  zPathname._4_4_ = iVar2 + 7U & 0xfffffff8;
  zFilename_local[0] = '\0';
  zFilename_local[1] = '\0';
  zFilename_local[2] = '\0';
  zFilename_local[3] = '\0';
  zFilename_local[4] = '\0';
  zFilename_local[5] = '\0';
  zFilename_local[6] = '\0';
  zFilename_local[7] = '\0';
  if ((((local_30 & 2) != 0) && (journalFileSize = 1, _flags_local != (char *)0x0)) &&
     (*_flags_local != '\0')) {
    _useJournal = sqlite3DbStrDup((sqlite3 *)0x0,_flags_local);
    if (_useJournal == (char *)0x0) {
      return 7;
    }
    pcacheSize = sqlite3Strlen30(_useJournal);
    _flags_local = (char *)0x0;
  }
  if ((_flags_local != (char *)0x0) && (*_flags_local != '\0')) {
    pcacheSize = *(int *)(ppPager_local + 1) + 1;
    _useJournal = (char *)sqlite3DbMallocRaw((sqlite3 *)0x0,(long)(pcacheSize * 2));
    if (_useJournal == (char *)0x0) {
      return 7;
    }
    *_useJournal = '\0';
    memDb = sqlite3OsFullPathname((sqlite3_vfs *)ppPager_local,_flags_local,pcacheSize,_useJournal);
    pcacheSize = sqlite3Strlen30(_useJournal);
    pcVar1 = _flags_local;
    iVar2 = sqlite3Strlen30(_flags_local);
    _iDc = pcVar1 + (iVar2 + 1);
    pcStack_80 = _iDc;
    for (; *_iDc != '\0'; _iDc = _iDc + (iVar2 + 1)) {
      iVar2 = sqlite3Strlen30(_iDc);
      _iDc = _iDc + (iVar2 + 1);
      iVar2 = sqlite3Strlen30(_iDc);
    }
    z._4_4_ = ((int)_iDc + 1) - (int)pcStack_80;
    if ((memDb == 0) && (*(int *)(ppPager_local + 1) < pcacheSize + 8)) {
      memDb = sqlite3CantopenError(0xd85e);
    }
    if (memDb != 0) {
      sqlite3DbFree((sqlite3 *)0x0,_useJournal);
      return memDb;
    }
  }
  pPVar4 = (Pager *)sqlite3MallocZero((long)(int)(zUri._4_4_ + 7U & 0xfffffff8) +
                                      (long)(int)(*(int *)((long)ppPager_local + 4) + 7U &
                                                 0xfffffff8) + (long)(int)(zPathname._4_4_ << 1) +
                                      (long)pcacheSize + (long)z._4_4_ + (long)pcacheSize +
                                      (long)pcacheSize + 0x141);
  if (pPVar4 == (Pager *)0x0) {
    pPager = pPVar4;
    sqlite3DbFree((sqlite3 *)0x0,_useJournal);
    return 7;
  }
  pPVar4->pPCache = (PCache *)(pPVar4 + 1);
  psVar5 = (sqlite3_file *)((long)&pPVar4[1].pVfs + (long)(int)(zUri._4_4_ + 7U & 0xfffffff8));
  pPVar4->fd = psVar5;
  psVar5 = (sqlite3_file *)
           ((long)&psVar5->pMethods +
           (long)(int)(*(int *)((long)ppPager_local + 4) + 7U & 0xfffffff8));
  pPVar4->sjfd = psVar5;
  psVar5 = (sqlite3_file *)((long)&psVar5->pMethods + (long)(int)zPathname._4_4_);
  pPVar4->jfd = psVar5;
  pPager = (Pager *)((long)&psVar5->pMethods + (long)(int)zPathname._4_4_);
  pPVar4->zFilename = (char *)pPager;
  _tempFile = pPVar4;
  if (_useJournal != (char *)0x0) {
    pPager = (Pager *)((long)&pPager->pVfs + (long)(pcacheSize + 1 + z._4_4_));
    pPVar4->zJournal = (char *)pPager;
    memcpy(pPVar4->zFilename,_useJournal,(long)pcacheSize);
    if (z._4_4_ != 0) {
      memcpy(_tempFile->zFilename + (pcacheSize + 1),pcStack_80,(long)z._4_4_);
    }
    memcpy(_tempFile->zJournal,_useJournal,(long)pcacheSize);
    builtin_strncpy(_tempFile->zJournal + pcacheSize,"-journal",9);
    (_tempFile->zJournal + (long)pcacheSize + 8)[1] = '\0';
    _tempFile->zWal = _tempFile->zJournal + (pcacheSize + 9);
    memcpy(_tempFile->zWal,_useJournal,(long)pcacheSize);
    builtin_strncpy(_tempFile->zWal + pcacheSize,"-wal",5);
    sqlite3DbFree((sqlite3 *)0x0,_useJournal);
  }
  _tempFile->pVfs = (sqlite3_vfs *)ppPager_local;
  _tempFile->vfsFlags = pPtr._4_4_;
  if ((_flags_local != (char *)0x0) && (*_flags_local != '\0')) {
    local_94 = 0;
    memDb = sqlite3OsOpen((sqlite3_vfs *)ppPager_local,_tempFile->zFilename,_tempFile->fd,pPtr._4_4_
                          ,(int *)&local_94);
    local_58 = (uint)((local_94 & 1) != 0);
    if (memDb != 0) goto LAB_0013e111;
    uVar3 = sqlite3OsDeviceCharacteristics(_tempFile->fd);
    if ((local_58 == 0) && (setSectorSize(_tempFile), (uint)zUri < _tempFile->sectorSize)) {
      if (_tempFile->sectorSize < 0x2001) {
        zUri._0_4_ = _tempFile->sectorSize;
      }
      else {
        zUri._0_4_ = 0x2000;
      }
    }
    iVar2 = sqlite3_uri_boolean(_flags_local,"nolock",0);
    _tempFile->noLock = (u8)iVar2;
    if (((uVar3 & 0x2000) == 0) &&
       (iVar2 = sqlite3_uri_boolean(_flags_local,"immutable",0), iVar2 == 0)) goto LAB_0013e111;
    pPtr._4_4_ = pPtr._4_4_ | 1;
  }
  readOnly = 1;
  _tempFile->eState = '\x01';
  _tempFile->eLock = '\x04';
  _tempFile->noLock = '\x01';
  local_58 = pPtr._4_4_ & 1;
LAB_0013e111:
  if (memDb == 0) {
    memDb = sqlite3PagerSetPagesize(_tempFile,(u32 *)&zUri,-1);
  }
  if (memDb == 0) {
    vfsFlags_local = vfsFlags_local + 7U & 0xfffffff8;
    xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
    if (journalFileSize == 0) {
      xStress = pagerStress;
    }
    memDb = sqlite3PcacheOpen((uint)zUri,vfsFlags_local,(journalFileSize != 0 ^ 0xff) & 1,xStress,
                              _tempFile,_tempFile->pPCache);
  }
  if (memDb == 0) {
    _tempFile->useJournal = (u8)szPageDflt;
    _tempFile->mxPgno = 0x3fffffff;
    _tempFile->tempFile = (u8)readOnly;
    _tempFile->exclusiveMode = (u8)readOnly;
    _tempFile->changeCountDone = _tempFile->tempFile;
    _tempFile->memDb = (u8)journalFileSize;
    _tempFile->readOnly = (u8)local_58;
    _tempFile->noSync = _tempFile->tempFile;
    if (_tempFile->noSync == '\0') {
      _tempFile->fullSync = '\x01';
      _tempFile->extraSync = '\0';
      _tempFile->syncFlags = '\x02';
      _tempFile->walSyncFlags = '\n';
    }
    _tempFile->nExtra = (u16)vfsFlags_local;
    _tempFile->journalSizeLimit = -1;
    setSectorSize(_tempFile);
    if (szPageDflt == 0) {
      _tempFile->journalMode = '\x02';
    }
    else if (journalFileSize != 0) {
      _tempFile->journalMode = '\x04';
    }
    _tempFile->xReiniter = xReinit;
    setGetterMethod(_tempFile);
    *(Pager **)zFilename_local = _tempFile;
    pVfs_local._4_4_ = 0;
  }
  else {
    sqlite3OsClose(_tempFile->fd);
    sqlite3PageFree(_tempFile->pTmpSpace);
    sqlite3_free(_tempFile);
    pVfs_local._4_4_ = memDb;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpen(
  sqlite3_vfs *pVfs,       /* The virtual file system to use */
  Pager **ppPager,         /* OUT: Return the Pager structure here */
  const char *zFilename,   /* Name of the database file to open */
  int nExtra,              /* Extra bytes append to each in-memory page */
  int flags,               /* flags controlling this file */
  int vfsFlags,            /* flags passed through to sqlite3_vfs.xOpen() */
  void (*xReinit)(DbPage*) /* Function to reinitialize pages */
){
  u8 *pPtr;
  Pager *pPager = 0;       /* Pager object to allocate and return */
  int rc = SQLITE_OK;      /* Return code */
  int tempFile = 0;        /* True for temp files (incl. in-memory files) */
  int memDb = 0;           /* True if this is an in-memory file */
#ifdef SQLITE_ENABLE_DESERIALIZE
  int memJM = 0;           /* Memory journal mode */
#else
# define memJM 0
#endif
  int readOnly = 0;        /* True if this is a read-only file */
  int journalFileSize;     /* Bytes to allocate for each journal fd */
  char *zPathname = 0;     /* Full path to database file */
  int nPathname = 0;       /* Number of bytes in zPathname */
  int useJournal = (flags & PAGER_OMIT_JOURNAL)==0; /* False to omit journal */
  int pcacheSize = sqlite3PcacheSize();       /* Bytes to allocate for PCache */
  u32 szPageDflt = SQLITE_DEFAULT_PAGE_SIZE;  /* Default page size */
  const char *zUri = 0;    /* URI args to copy */
  int nUri = 0;            /* Number of bytes of URI args at *zUri */

  /* Figure out how much space is required for each journal file-handle
  ** (there are two of them, the main journal and the sub-journal).  */
  journalFileSize = ROUND8(sqlite3JournalSize(pVfs));

  /* Set the output variable to NULL in case an error occurs. */
  *ppPager = 0;

#ifndef SQLITE_OMIT_MEMORYDB
  if( flags & PAGER_MEMORY ){
    memDb = 1;
    if( zFilename && zFilename[0] ){
      zPathname = sqlite3DbStrDup(0, zFilename);
      if( zPathname==0  ) return SQLITE_NOMEM_BKPT;
      nPathname = sqlite3Strlen30(zPathname);
      zFilename = 0;
    }
  }
#endif

  /* Compute and store the full pathname in an allocated buffer pointed
  ** to by zPathname, length nPathname. Or, if this is a temporary file,
  ** leave both nPathname and zPathname set to 0.
  */
  if( zFilename && zFilename[0] ){
    const char *z;
    nPathname = pVfs->mxPathname+1;
    zPathname = sqlite3DbMallocRaw(0, nPathname*2);
    if( zPathname==0 ){
      return SQLITE_NOMEM_BKPT;
    }
    zPathname[0] = 0; /* Make sure initialized even if FullPathname() fails */
    rc = sqlite3OsFullPathname(pVfs, zFilename, nPathname, zPathname);
    nPathname = sqlite3Strlen30(zPathname);
    z = zUri = &zFilename[sqlite3Strlen30(zFilename)+1];
    while( *z ){
      z += sqlite3Strlen30(z)+1;
      z += sqlite3Strlen30(z)+1;
    }
    nUri = (int)(&z[1] - zUri);
    assert( nUri>=0 );
    if( rc==SQLITE_OK && nPathname+8>pVfs->mxPathname ){
      /* This branch is taken when the journal path required by
      ** the database being opened will be more than pVfs->mxPathname
      ** bytes in length. This means the database cannot be opened,
      ** as it will not be possible to open the journal file or even
      ** check for a hot-journal before reading.
      */
      rc = SQLITE_CANTOPEN_BKPT;
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(0, zPathname);
      return rc;
    }
  }

  /* Allocate memory for the Pager structure, PCache object, the
  ** three file descriptors, the database file name and the journal 
  ** file name. The layout in memory is as follows:
  **
  **     Pager object                    (sizeof(Pager) bytes)
  **     PCache object                   (sqlite3PcacheSize() bytes)
  **     Database file handle            (pVfs->szOsFile bytes)
  **     Sub-journal file handle         (journalFileSize bytes)
  **     Main journal file handle        (journalFileSize bytes)
  **     Database file name              (nPathname+1 bytes)
  **     Journal file name               (nPathname+8+1 bytes)
  */
  pPtr = (u8 *)sqlite3MallocZero(
    ROUND8(sizeof(*pPager)) +      /* Pager structure */
    ROUND8(pcacheSize) +           /* PCache object */
    ROUND8(pVfs->szOsFile) +       /* The main db file */
    journalFileSize * 2 +          /* The two journal files */ 
    nPathname + 1 + nUri +         /* zFilename */
    nPathname + 8 + 2              /* zJournal */
#ifndef SQLITE_OMIT_WAL
    + nPathname + 4 + 2            /* zWal */
#endif
  );
  assert( EIGHT_BYTE_ALIGNMENT(SQLITE_INT_TO_PTR(journalFileSize)) );
  if( !pPtr ){
    sqlite3DbFree(0, zPathname);
    return SQLITE_NOMEM_BKPT;
  }
  pPager =              (Pager*)(pPtr);
  pPager->pPCache =    (PCache*)(pPtr += ROUND8(sizeof(*pPager)));
  pPager->fd =   (sqlite3_file*)(pPtr += ROUND8(pcacheSize));
  pPager->sjfd = (sqlite3_file*)(pPtr += ROUND8(pVfs->szOsFile));
  pPager->jfd =  (sqlite3_file*)(pPtr += journalFileSize);
  pPager->zFilename =    (char*)(pPtr += journalFileSize);
  assert( EIGHT_BYTE_ALIGNMENT(pPager->jfd) );

  /* Fill in the Pager.zFilename and Pager.zJournal buffers, if required. */
  if( zPathname ){
    assert( nPathname>0 );
    pPager->zJournal =   (char*)(pPtr += nPathname + 1 + nUri);
    memcpy(pPager->zFilename, zPathname, nPathname);
    if( nUri ) memcpy(&pPager->zFilename[nPathname+1], zUri, nUri);
    memcpy(pPager->zJournal, zPathname, nPathname);
    memcpy(&pPager->zJournal[nPathname], "-journal\000", 8+2);
    sqlite3FileSuffix3(pPager->zFilename, pPager->zJournal);
#ifndef SQLITE_OMIT_WAL
    pPager->zWal = &pPager->zJournal[nPathname+8+1];
    memcpy(pPager->zWal, zPathname, nPathname);
    memcpy(&pPager->zWal[nPathname], "-wal\000", 4+1);
    sqlite3FileSuffix3(pPager->zFilename, pPager->zWal);
#endif
    sqlite3DbFree(0, zPathname);
  }
  pPager->pVfs = pVfs;
  pPager->vfsFlags = vfsFlags;

  /* Open the pager file.
  */
  if( zFilename && zFilename[0] ){
    int fout = 0;                    /* VFS flags returned by xOpen() */
    rc = sqlite3OsOpen(pVfs, pPager->zFilename, pPager->fd, vfsFlags, &fout);
    assert( !memDb );
#ifdef SQLITE_ENABLE_DESERIALIZE
    memJM = (fout&SQLITE_OPEN_MEMORY)!=0;
#endif
    readOnly = (fout&SQLITE_OPEN_READONLY)!=0;

    /* If the file was successfully opened for read/write access,
    ** choose a default page size in case we have to create the
    ** database file. The default page size is the maximum of:
    **
    **    + SQLITE_DEFAULT_PAGE_SIZE,
    **    + The value returned by sqlite3OsSectorSize()
    **    + The largest page size that can be written atomically.
    */
    if( rc==SQLITE_OK ){
      int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      if( !readOnly ){
        setSectorSize(pPager);
        assert(SQLITE_DEFAULT_PAGE_SIZE<=SQLITE_MAX_DEFAULT_PAGE_SIZE);
        if( szPageDflt<pPager->sectorSize ){
          if( pPager->sectorSize>SQLITE_MAX_DEFAULT_PAGE_SIZE ){
            szPageDflt = SQLITE_MAX_DEFAULT_PAGE_SIZE;
          }else{
            szPageDflt = (u32)pPager->sectorSize;
          }
        }
#ifdef SQLITE_ENABLE_ATOMIC_WRITE
        {
          int ii;
          assert(SQLITE_IOCAP_ATOMIC512==(512>>8));
          assert(SQLITE_IOCAP_ATOMIC64K==(65536>>8));
          assert(SQLITE_MAX_DEFAULT_PAGE_SIZE<=65536);
          for(ii=szPageDflt; ii<=SQLITE_MAX_DEFAULT_PAGE_SIZE; ii=ii*2){
            if( iDc&(SQLITE_IOCAP_ATOMIC|(ii>>8)) ){
              szPageDflt = ii;
            }
          }
        }
#endif
      }
      pPager->noLock = sqlite3_uri_boolean(zFilename, "nolock", 0);
      if( (iDc & SQLITE_IOCAP_IMMUTABLE)!=0
       || sqlite3_uri_boolean(zFilename, "immutable", 0) ){
          vfsFlags |= SQLITE_OPEN_READONLY;
          goto act_like_temp_file;
      }
    }
  }else{
    /* If a temporary file is requested, it is not opened immediately.
    ** In this case we accept the default page size and delay actually
    ** opening the file until the first call to OsWrite().
    **
    ** This branch is also run for an in-memory database. An in-memory
    ** database is the same as a temp-file that is never written out to
    ** disk and uses an in-memory rollback journal.
    **
    ** This branch also runs for files marked as immutable.
    */ 
act_like_temp_file:
    tempFile = 1;
    pPager->eState = PAGER_READER;     /* Pretend we already have a lock */
    pPager->eLock = EXCLUSIVE_LOCK;    /* Pretend we are in EXCLUSIVE mode */
    pPager->noLock = 1;                /* Do no locking */
    readOnly = (vfsFlags&SQLITE_OPEN_READONLY);
  }

  /* The following call to PagerSetPagesize() serves to set the value of 
  ** Pager.pageSize and to allocate the Pager.pTmpSpace buffer.
  */
  if( rc==SQLITE_OK ){
    assert( pPager->memDb==0 );
    rc = sqlite3PagerSetPagesize(pPager, &szPageDflt, -1);
    testcase( rc!=SQLITE_OK );
  }

  /* Initialize the PCache object. */
  if( rc==SQLITE_OK ){
    nExtra = ROUND8(nExtra);
    assert( nExtra>=8 && nExtra<1000 );
    rc = sqlite3PcacheOpen(szPageDflt, nExtra, !memDb,
                       !memDb?pagerStress:0, (void *)pPager, pPager->pPCache);
  }

  /* If an error occurred above, free the  Pager structure and close the file.
  */
  if( rc!=SQLITE_OK ){
    sqlite3OsClose(pPager->fd);
    sqlite3PageFree(pPager->pTmpSpace);
    sqlite3_free(pPager);
    return rc;
  }

  PAGERTRACE(("OPEN %d %s\n", FILEHANDLEID(pPager->fd), pPager->zFilename));
  IOTRACE(("OPEN %p %s\n", pPager, pPager->zFilename))

  pPager->useJournal = (u8)useJournal;
  /* pPager->stmtOpen = 0; */
  /* pPager->stmtInUse = 0; */
  /* pPager->nRef = 0; */
  /* pPager->stmtSize = 0; */
  /* pPager->stmtJSize = 0; */
  /* pPager->nPage = 0; */
  pPager->mxPgno = SQLITE_MAX_PAGE_COUNT;
  /* pPager->state = PAGER_UNLOCK; */
  /* pPager->errMask = 0; */
  pPager->tempFile = (u8)tempFile;
  assert( tempFile==PAGER_LOCKINGMODE_NORMAL 
          || tempFile==PAGER_LOCKINGMODE_EXCLUSIVE );
  assert( PAGER_LOCKINGMODE_EXCLUSIVE==1 );
  pPager->exclusiveMode = (u8)tempFile; 
  pPager->changeCountDone = pPager->tempFile;
  pPager->memDb = (u8)memDb;
  pPager->readOnly = (u8)readOnly;
  assert( useJournal || pPager->tempFile );
  pPager->noSync = pPager->tempFile;
  if( pPager->noSync ){
    assert( pPager->fullSync==0 );
    assert( pPager->extraSync==0 );
    assert( pPager->syncFlags==0 );
    assert( pPager->walSyncFlags==0 );
  }else{
    pPager->fullSync = 1;
    pPager->extraSync = 0;
    pPager->syncFlags = SQLITE_SYNC_NORMAL;
    pPager->walSyncFlags = SQLITE_SYNC_NORMAL | (SQLITE_SYNC_NORMAL<<2);
  }
  /* pPager->pFirst = 0; */
  /* pPager->pFirstSynced = 0; */
  /* pPager->pLast = 0; */
  pPager->nExtra = (u16)nExtra;
  pPager->journalSizeLimit = SQLITE_DEFAULT_JOURNAL_SIZE_LIMIT;
  assert( isOpen(pPager->fd) || tempFile );
  setSectorSize(pPager);
  if( !useJournal ){
    pPager->journalMode = PAGER_JOURNALMODE_OFF;
  }else if( memDb || memJM ){
    pPager->journalMode = PAGER_JOURNALMODE_MEMORY;
  }
  /* pPager->xBusyHandler = 0; */
  /* pPager->pBusyHandlerArg = 0; */
  pPager->xReiniter = xReinit;
  setGetterMethod(pPager);
  /* memset(pPager->aHash, 0, sizeof(pPager->aHash)); */
  /* pPager->szMmap = SQLITE_DEFAULT_MMAP_SIZE // will be set by btree.c */

  *ppPager = pPager;
  return SQLITE_OK;
}